

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O1

void __thiscall Sexp::TracePointers(Sexp *this,function<void_(Sexp_**)> *func)

{
  Activation *pAVar1;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  anon_union_16_11_d0fa9a51_for_Sexp_2 *local_30;
  
  switch(this->kind) {
  case ACTIVATION:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function((function<void_(Sexp_**)> *)&local_70,func);
    Activation::TracePointers(pAVar1,(function<void_(Sexp_**)> *)&local_70);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    break;
  case FUNCTION:
  case MACRO:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function((function<void_(Sexp_**)> *)&local_90,func);
    (**(code **)(pAVar1->parent + 1))(pAVar1,&local_90);
    if (local_80 != (code *)0x0) {
      (*local_80)(&local_90,&local_90,__destroy_functor);
    }
    goto LAB_0010f2d3;
  case NATIVE_FUNCTION:
  case CHARACTER:
  case PORT:
    break;
  case MEANING:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function((function<void_(Sexp_**)> *)&local_50,func);
    (**(code **)(pAVar1->parent + 1))(pAVar1,&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    break;
  default:
    if (this->kind != CONS) {
      return;
    }
    local_30 = &this->field_1;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0010f364;
    (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_30);
LAB_0010f2d3:
    local_30 = (anon_union_16_11_d0fa9a51_for_Sexp_2 *)((long)&this->field_1 + 8);
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0010f364:
      std::__throw_bad_function_call();
    }
    (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_30);
  }
  return;
}

Assistant:

void Sexp::TracePointers(std::function<void(Sexp **)> func) {
  switch (kind) {
  case Sexp::Kind::CONS:
    func(&this->cons.car);
    func(&this->cons.cdr);
    break;
  case Sexp::Kind::MACRO:
  case Sexp::Kind::FUNCTION:
    this->function.func_meaning->TracePointers(func);
    func(&this->function.activation);
    break;
  case Sexp::Kind::ACTIVATION:
    this->activation->TracePointers(func);
    break;
  case Sexp::Kind::MEANING:
    this->meaning->TracePointers(func);
  default:
    break;
  }
}